

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExpressionLhs<bool>::reconstructExpression(ExpressionLhs<bool> *this,string *dest)

{
  bool in_DL;
  string local_38;
  string *local_18;
  string *dest_local;
  ExpressionLhs<bool> *this_local;
  
  local_18 = dest;
  dest_local = (string *)this;
  Catch::toString_abi_cxx11_(&local_38,(Catch *)(ulong)(this->m_truthy & 1),in_DL);
  std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

virtual void reconstructExpression( std::string& dest ) const CATCH_OVERRIDE {
        dest = Catch::toString( m_truthy );
    }